

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
::parallel_hash_set(parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                    *this,parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                          *that,allocator_type *a)

{
  long lVar1;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  local_70;
  
  std::
  array<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>::Inner,_16UL>
  ::array(&this->sets_);
  for (lVar1 = 0; lVar1 != 0x480; lVar1 = lVar1 + 0x48) {
    raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
    ::raw_hash_set(&local_70,
                   (raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                    *)((long)&(that->sets_)._M_elems[0].set_.ctrl_ + lVar1),a);
    raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
    ::move_assign((raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                   *)((long)&(this->sets_)._M_elems[0].set_.ctrl_ + lVar1),&local_70);
    raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
    ::~raw_hash_set(&local_70);
  }
  return;
}

Assistant:

parallel_hash_set(parallel_hash_set&& that, const allocator_type& a)
    {
        for (size_t i=0; i<num_tables; ++i)
            sets_[i].set_ = { std::move(that.sets_[i]).set_, a };
    }